

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

void botpTimeToCtr(octet *ctr,tm_time_t t)

{
  void *in_RSI;
  void *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  octet in_stack_ffffffffffffffef;
  
  memSet(in_RSI,in_stack_ffffffffffffffef,0x15aa3e);
  memCopy(in_RSI,(void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0x15aa5a);
  memRev(in_RDI,8);
  return;
}

Assistant:

static void botpTimeToCtr(octet ctr[8], tm_time_t t)
{
	ASSERT(sizeof(t) <= 8);
	memSetZero(ctr, 8 - sizeof(t));
	memCopy(ctr + 8 - sizeof(t), &t, sizeof(t));
#if (OCTET_ORDER == LITTLE_ENDIAN)
	memRev(ctr + 8 - sizeof(t), sizeof(t));
#endif
}